

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O1

size_t __thiscall
MADPComponentDiscreteActions::GetNrJointActions(MADPComponentDiscreteActions *this)

{
  undefined8 *puVar1;
  E *this_00;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,"MADPComponentDiscreteActions::GetNrJointActions(",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_188,") - Error: not initialized. ",0x1c);
    std::endl<char,std::char_traits<char>>(local_188);
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar1 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar1,&E::typeinfo,E::~E);
  }
  if (this->_m_jointIndicesValid != false) {
    return this->_m_nrJointActions;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,
       "MADPComponentDiscreteActions::GetNrJointActions() joint indices are not available, overflow detected"
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteActions::GetNrJointActions() const
{
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "MADPComponentDiscreteActions::GetNrJointActions("<< 
            ") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(!_m_jointIndicesValid)
    {
        throw(E("MADPComponentDiscreteActions::GetNrJointActions() joint indices are not available, overflow detected"));
    }
    return(_m_nrJointActions);
}